

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticAnalyserTests.cpp
# Opt level: O0

void __thiscall
SemanticAnalyserTest_VariableDefinitionsWork_Test::
~SemanticAnalyserTest_VariableDefinitionsWork_Test
          (SemanticAnalyserTest_VariableDefinitionsWork_Test *this)

{
  void *in_RDI;
  
  ~SemanticAnalyserTest_VariableDefinitionsWork_Test
            ((SemanticAnalyserTest_VariableDefinitionsWork_Test *)0x1e8b18);
  operator_delete(in_RDI,0x10);
  return;
}

Assistant:

TEST(SemanticAnalyserTest, VariableDefinitionsWork)
{
  std::string source = R"SRC(
  fn main(): f32
  {
    let x: f32 = 2;
    let y: f32 = 5;

    ret 0;
  }
  )SRC";
  nothrowTest(source);
}